

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O3

float __thiscall nv::FloatImage::sampleNearestClamp(FloatImage *this,float x,float y,int c)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = this->m_width;
  uVar3 = (uint)((float)uVar1 * x);
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  if (uVar1 <= uVar3) {
    uVar3 = uVar1 - 1;
  }
  uVar2 = this->m_height;
  uVar5 = (uint)((float)uVar2 * y);
  uVar4 = 0;
  if (0 < (int)uVar5) {
    uVar4 = uVar5;
  }
  if (uVar2 <= uVar4) {
    uVar4 = uVar2 - 1;
  }
  return this->m_mem[(c * (uint)uVar2 + uVar4) * (uint)uVar1 + uVar3];
}

Assistant:

float FloatImage::sampleNearestClamp(const float x, const float y, const int c) const
{
	int ix = ::clamp(iround(x * m_width), 0, m_width-1);
	int iy = ::clamp(iround(y * m_height), 0, m_height-1);
	return pixel(ix, iy, c);
}